

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isTrilinearPCFCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec4 *depths0,Vec4 *depths1,
               Vec2 *xBounds0,Vec2 *yBounds0,Vec2 *xBounds1,Vec2 *yBounds1,Vec2 *fBounds,
               float cmpReference,float result,bool isFixedPointDepth)

{
  bool bVar1;
  CmpResultSet CVar2;
  CmpResultSet CVar3;
  CmpResultSet CVar4;
  CmpResultSet CVar5;
  CmpResultSet CVar6;
  CmpResultSet CVar7;
  CmpResultSet CVar8;
  CmpResultSet CVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float maxR;
  float minR;
  float maxF;
  float minF;
  float maxF1;
  float maxF0;
  float minF1;
  float minF0;
  float maxV1;
  float minV1;
  float v13;
  float v12;
  float v11;
  float v10;
  float maxV0;
  float minV0;
  float v03;
  float v02;
  float v01;
  float v00;
  Vector<float,_4> local_c4;
  undefined1 local_b4 [8];
  Vec4 refVal1;
  Vector<float,_4> local_94;
  undefined1 local_84 [8];
  Vec4 refVal0;
  BVec4 cmpTrue1;
  BVec4 cmpTrue0;
  deUint32 comb;
  float totalErr;
  float resErr;
  float pcfErr;
  deUint32 isFalse;
  deUint32 isTrue;
  bool bStack_4c;
  bool local_4b;
  bool bStack_4a;
  CmpResultSet cmp13;
  CmpResultSet cmp12;
  CmpResultSet cmp11;
  CmpResultSet cmp10;
  CmpResultSet cmp03;
  CmpResultSet cmp02;
  CmpResultSet cmp01;
  CmpResultSet cmp00;
  bool isFixedPointDepth_local;
  float result_local;
  float cmpReference_local;
  Vec2 *yBounds0_local;
  Vec2 *xBounds0_local;
  Vec4 *depths1_local;
  Vec4 *depths0_local;
  TexComparePrecision *prec_local;
  CompareMode compareMode_local;
  
  pfVar10 = Vector<float,_4>::operator[](depths0,0);
  CVar2 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths0,1);
  CVar3 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths0,2);
  CVar4 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths0,3);
  CVar5 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths1,0);
  CVar6 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths1,1);
  CVar7 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths1,2);
  CVar8 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths1,3);
  CVar9 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  cmp10.isTrue = CVar2.isTrue;
  cmp11.isTrue = CVar3.isTrue;
  cmp12.isTrue = CVar4.isTrue;
  cmp13.isTrue = CVar5.isTrue;
  local_4b = CVar6.isTrue;
  isTrue._3_1_ = CVar7.isTrue;
  isTrue._1_1_ = CVar8.isTrue;
  isFalse._3_1_ = CVar9.isTrue;
  cmp10.isFalse = CVar2.isFalse;
  cmp11.isFalse = CVar3.isFalse;
  cmp12.isFalse = CVar4.isFalse;
  cmp13.isFalse = CVar5.isFalse;
  bStack_4a = CVar6.isFalse;
  bStack_4c = CVar7.isFalse;
  isTrue._2_1_ = CVar8.isFalse;
  isTrue._0_1_ = CVar9.isFalse;
  fVar11 = TexVerifierUtil::computeFixedPointError(prec->pcfBits);
  fVar12 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
  cmpTrue1.m_data[0] = false;
  cmpTrue1.m_data[1] = false;
  cmpTrue1.m_data[2] = false;
  cmpTrue1.m_data[3] = false;
  do {
    if (0xff < (uint)cmpTrue1.m_data) {
      return false;
    }
    if (((uint)cmpTrue1.m_data &
         ((uint)(cmp10.isTrue & 1) | (uint)(cmp11.isTrue & 1) << 1 | (uint)(cmp12.isTrue & 1) << 2 |
          (uint)(cmp13.isTrue & 1) << 3 | (uint)(local_4b & 1) << 4 | (uint)(isTrue._3_1_ & 1) << 5
          | (uint)(isTrue._1_1_ & 1) << 6 | (uint)(isFalse._3_1_ & 1) << 7) |
        ((uint)cmpTrue1.m_data ^ 0xffffffff) &
        ((uint)(cmp10.isFalse & 1) | (uint)(cmp11.isFalse & 1) << 1 | (uint)(cmp12.isFalse & 1) << 2
         | (uint)(cmp13.isFalse & 1) << 3 | (uint)(bStack_4a & 1) << 4 | (uint)(bStack_4c & 1) << 5
         | (uint)(isTrue._2_1_ & 1) << 6 | (uint)(isTrue._0_1_ & 1) << 7)) == 0xff) {
      extractBVec4((tcu *)(refVal0.m_data + 3),(deUint32)cmpTrue1.m_data,0);
      extractBVec4((tcu *)(refVal0.m_data + 2),(deUint32)cmpTrue1.m_data,4);
      Vector<float,_4>::Vector(&local_94,1.0);
      Vector<float,_4>::Vector((Vector<float,_4> *)(refVal1.m_data + 2),0.0);
      select<float,4>((tcu *)local_84,&local_94,(Vector<float,_4> *)(refVal1.m_data + 2),
                      (Vector<bool,_4> *)(refVal0.m_data + 3));
      Vector<float,_4>::Vector(&local_c4,1.0);
      Vector<float,_4>::Vector((Vector<float,_4> *)&v01,0.0);
      select<float,4>((tcu *)local_b4,&local_c4,(Vector<float,_4> *)&v01,
                      (Vector<bool,_4> *)(refVal0.m_data + 2));
      fVar13 = Vector<float,_2>::x(xBounds0);
      fVar14 = Vector<float,_2>::x(yBounds0);
      fVar13 = bilinearInterpolate((Vec4 *)local_84,fVar13,fVar14);
      fVar14 = Vector<float,_2>::y(xBounds0);
      fVar15 = Vector<float,_2>::x(yBounds0);
      fVar14 = bilinearInterpolate((Vec4 *)local_84,fVar14,fVar15);
      fVar15 = Vector<float,_2>::x(xBounds0);
      fVar16 = Vector<float,_2>::y(yBounds0);
      fVar15 = bilinearInterpolate((Vec4 *)local_84,fVar15,fVar16);
      fVar16 = Vector<float,_2>::y(xBounds0);
      fVar17 = Vector<float,_2>::y(yBounds0);
      fVar16 = bilinearInterpolate((Vec4 *)local_84,fVar16,fVar17);
      fVar17 = de::min<float>(fVar15,fVar16);
      fVar17 = de::min<float>(fVar14,fVar17);
      fVar17 = de::min<float>(fVar13,fVar17);
      fVar15 = de::max<float>(fVar15,fVar16);
      fVar14 = de::max<float>(fVar14,fVar15);
      fVar13 = de::max<float>(fVar13,fVar14);
      fVar14 = Vector<float,_2>::x(xBounds1);
      fVar15 = Vector<float,_2>::x(yBounds1);
      fVar14 = bilinearInterpolate((Vec4 *)local_b4,fVar14,fVar15);
      fVar15 = Vector<float,_2>::y(xBounds1);
      fVar16 = Vector<float,_2>::x(yBounds1);
      fVar15 = bilinearInterpolate((Vec4 *)local_b4,fVar15,fVar16);
      fVar16 = Vector<float,_2>::x(xBounds1);
      fVar18 = Vector<float,_2>::y(yBounds1);
      fVar16 = bilinearInterpolate((Vec4 *)local_b4,fVar16,fVar18);
      fVar18 = Vector<float,_2>::y(xBounds1);
      fVar19 = Vector<float,_2>::y(yBounds1);
      fVar18 = bilinearInterpolate((Vec4 *)local_b4,fVar18,fVar19);
      fVar19 = de::min<float>(fVar16,fVar18);
      fVar19 = de::min<float>(fVar15,fVar19);
      fVar19 = de::min<float>(fVar14,fVar19);
      fVar16 = de::max<float>(fVar16,fVar18);
      fVar15 = de::max<float>(fVar15,fVar16);
      fVar14 = de::max<float>(fVar14,fVar15);
      fVar15 = Vector<float,_2>::x(fBounds);
      fVar16 = Vector<float,_2>::x(fBounds);
      fVar18 = Vector<float,_2>::y(fBounds);
      fVar20 = Vector<float,_2>::y(fBounds);
      fVar21 = Vector<float,_2>::x(fBounds);
      fVar22 = Vector<float,_2>::x(fBounds);
      fVar23 = Vector<float,_2>::y(fBounds);
      fVar24 = Vector<float,_2>::y(fBounds);
      fVar15 = de::min<float>(fVar17 * (1.0 - fVar15) + fVar19 * fVar16,
                              fVar17 * (1.0 - fVar18) + fVar19 * fVar20);
      fVar13 = de::max<float>(fVar13 * (1.0 - fVar21) + fVar14 * fVar22,
                              fVar13 * (1.0 - fVar23) + fVar14 * fVar24);
      bVar1 = de::inRange<float>(result,fVar15 - (fVar11 + fVar12),fVar13 + fVar11 + fVar12);
      if (bVar1) {
        return true;
      }
    }
    cmpTrue1.m_data = cmpTrue1.m_data + 1;
  } while( true );
}

Assistant:

static bool isTrilinearPCFCompareValid (const Sampler::CompareMode	compareMode,
										const TexComparePrecision&	prec,
										const Vec4&					depths0,
										const Vec4&					depths1,
										const Vec2&					xBounds0,
										const Vec2&					yBounds0,
										const Vec2&					xBounds1,
										const Vec2&					yBounds1,
										const Vec2&					fBounds,
										const float					cmpReference,
										const float					result,
										const bool					isFixedPointDepth)
{
	DE_ASSERT(0.0f <= xBounds0.x() && xBounds0.x() <= xBounds0.y() && xBounds0.y() <= 1.0f);
	DE_ASSERT(0.0f <= yBounds0.x() && yBounds0.x() <= yBounds0.y() && yBounds0.y() <= 1.0f);
	DE_ASSERT(0.0f <= xBounds1.x() && xBounds1.x() <= xBounds1.y() && xBounds1.y() <= 1.0f);
	DE_ASSERT(0.0f <= yBounds1.x() && yBounds1.x() <= yBounds1.y() && yBounds1.y() <= 1.0f);
	DE_ASSERT(0.0f <= fBounds.x() && fBounds.x() <= fBounds.y() && fBounds.y() <= 1.0f);
	DE_ASSERT(prec.pcfBits > 0);

	const CmpResultSet	cmp00		= execCompare(compareMode, depths0[0], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp01		= execCompare(compareMode, depths0[1], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp02		= execCompare(compareMode, depths0[2], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp03		= execCompare(compareMode, depths0[3], cmpReference, prec.referenceBits, isFixedPointDepth);

	const CmpResultSet	cmp10		= execCompare(compareMode, depths1[0], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp11		= execCompare(compareMode, depths1[1], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp12		= execCompare(compareMode, depths1[2], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp13		= execCompare(compareMode, depths1[3], cmpReference, prec.referenceBits, isFixedPointDepth);

	const deUint32		isTrue		= (deUint32(cmp00.isTrue)<<0)
									| (deUint32(cmp01.isTrue)<<1)
									| (deUint32(cmp02.isTrue)<<2)
									| (deUint32(cmp03.isTrue)<<3)
									| (deUint32(cmp10.isTrue)<<4)
									| (deUint32(cmp11.isTrue)<<5)
									| (deUint32(cmp12.isTrue)<<6)
									| (deUint32(cmp13.isTrue)<<7);
	const deUint32		isFalse		= (deUint32(cmp00.isFalse)<<0)
									| (deUint32(cmp01.isFalse)<<1)
									| (deUint32(cmp02.isFalse)<<2)
									| (deUint32(cmp03.isFalse)<<3)
									| (deUint32(cmp10.isFalse)<<4)
									| (deUint32(cmp11.isFalse)<<5)
									| (deUint32(cmp12.isFalse)<<6)
									| (deUint32(cmp13.isFalse)<<7);

	// Error parameters
	const float			pcfErr		= computeFixedPointError(prec.pcfBits);
	const float			resErr		= computeFixedPointError(prec.resultBits);
	const float			totalErr	= pcfErr+resErr;

	// Iterate over all valid combinations.
	for (deUint32 comb = 0; comb < (1<<8); comb++)
	{
		// Filter out invalid combinations.
		if (((comb & isTrue) | (~comb & isFalse)) != (1<<8)-1)
			continue;

		const BVec4		cmpTrue0	= extractBVec4(comb, 0);
		const BVec4		cmpTrue1	= extractBVec4(comb, 4);
		const Vec4		refVal0		= select(Vec4(1.0f), Vec4(0.0f), cmpTrue0);
		const Vec4		refVal1		= select(Vec4(1.0f), Vec4(0.0f), cmpTrue1);

		// Bilinear interpolation within levels.
		const float		v00			= bilinearInterpolate(refVal0, xBounds0.x(), yBounds0.x());
		const float		v01			= bilinearInterpolate(refVal0, xBounds0.y(), yBounds0.x());
		const float		v02			= bilinearInterpolate(refVal0, xBounds0.x(), yBounds0.y());
		const float		v03			= bilinearInterpolate(refVal0, xBounds0.y(), yBounds0.y());
		const float		minV0		= de::min(v00, de::min(v01, de::min(v02, v03)));
		const float		maxV0		= de::max(v00, de::max(v01, de::max(v02, v03)));

		const float		v10			= bilinearInterpolate(refVal1, xBounds1.x(), yBounds1.x());
		const float		v11			= bilinearInterpolate(refVal1, xBounds1.y(), yBounds1.x());
		const float		v12			= bilinearInterpolate(refVal1, xBounds1.x(), yBounds1.y());
		const float		v13			= bilinearInterpolate(refVal1, xBounds1.y(), yBounds1.y());
		const float		minV1		= de::min(v10, de::min(v11, de::min(v12, v13)));
		const float		maxV1		= de::max(v10, de::max(v11, de::max(v12, v13)));

		// Compute min-max bounds by filtering between minimum bounds and maximum bounds between levels.
		// HW can end up choosing pretty much any of samples between levels, and thus interpolating
		// between minimums should yield lower bound for range, and same for upper bound.
		// \todo [2013-07-17 pyry] This seems separable? Can this be optimized? At least ranges could be pre-computed and later combined.
		const float		minF0		= minV0*(1.0f-fBounds.x()) + minV1*fBounds.x();
		const float		minF1		= minV0*(1.0f-fBounds.y()) + minV1*fBounds.y();
		const float		maxF0		= maxV0*(1.0f-fBounds.x()) + maxV1*fBounds.x();
		const float		maxF1		= maxV0*(1.0f-fBounds.y()) + maxV1*fBounds.y();

		const float		minF		= de::min(minF0, minF1);
		const float		maxF		= de::max(maxF0, maxF1);

		const float		minR		= minF-totalErr;
		const float		maxR		= maxF+totalErr;

		if (de::inRange(result, minR, maxR))
			return true;
	}

	return false;
}